

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_gen_key(mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                       void *p_rng,uint nbits,int exponent)

{
  int iVar1;
  size_t sVar2;
  uint local_94;
  int local_84;
  undefined1 local_80 [4];
  int prime_quality;
  mbedtls_mpi L;
  mbedtls_mpi G;
  mbedtls_mpi H;
  int ret;
  int exponent_local;
  uint nbits_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  local_84 = 0;
  if (((nbits < 0x80) || (exponent < 3)) || ((nbits & 1) != 0)) {
    ctx_local._4_4_ = -0x4080;
  }
  else {
    if (0x400 < nbits) {
      local_84 = 2;
    }
    mbedtls_mpi_init((mbedtls_mpi *)&G.p);
    mbedtls_mpi_init((mbedtls_mpi *)&L.p);
    mbedtls_mpi_init((mbedtls_mpi *)local_80);
    H.p._4_4_ = mbedtls_mpi_lset(&ctx->E,(long)exponent);
    if (H.p._4_4_ == 0) {
      do {
        do {
          do {
            H.p._4_4_ = mbedtls_mpi_gen_prime(&ctx->P,(ulong)(nbits >> 1),local_84,f_rng,p_rng);
            if (((H.p._4_4_ != 0) ||
                (H.p._4_4_ = mbedtls_mpi_gen_prime(&ctx->Q,(ulong)(nbits >> 1),local_84,f_rng,p_rng)
                , H.p._4_4_ != 0)) ||
               (H.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)&G.p,&ctx->P,&ctx->Q), H.p._4_4_ != 0
               )) goto LAB_0013ae8a;
            sVar2 = mbedtls_mpi_bitlen((mbedtls_mpi *)&G.p);
            if (nbits < 200) {
              local_94 = 0;
            }
            else {
              local_94 = (nbits >> 1) - 99;
            }
          } while (sVar2 <= local_94);
          if ((int)G.p < 0) {
            mbedtls_mpi_swap(&ctx->P,&ctx->Q);
          }
          H.p._4_4_ = mbedtls_mpi_sub_int(&ctx->P,&ctx->P,1);
          if (((H.p._4_4_ != 0) ||
              (H.p._4_4_ = mbedtls_mpi_sub_int(&ctx->Q,&ctx->Q,1), H.p._4_4_ != 0)) ||
             ((H.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&G.p,&ctx->P,&ctx->Q), H.p._4_4_ != 0
              || (H.p._4_4_ = mbedtls_mpi_gcd((mbedtls_mpi *)&L.p,&ctx->E,(mbedtls_mpi *)&G.p),
                 H.p._4_4_ != 0)))) goto LAB_0013ae8a;
          iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&L.p,1);
        } while (iVar1 != 0);
        H.p._4_4_ = mbedtls_mpi_gcd((mbedtls_mpi *)&L.p,&ctx->P,&ctx->Q);
        if (((H.p._4_4_ != 0) ||
            (H.p._4_4_ = mbedtls_mpi_div_mpi((mbedtls_mpi *)local_80,(mbedtls_mpi *)0x0,
                                             (mbedtls_mpi *)&G.p,(mbedtls_mpi *)&L.p),
            H.p._4_4_ != 0)) ||
           (H.p._4_4_ = mbedtls_mpi_inv_mod(&ctx->D,&ctx->E,(mbedtls_mpi *)local_80), H.p._4_4_ != 0
           )) goto LAB_0013ae8a;
        sVar2 = mbedtls_mpi_bitlen(&ctx->D);
      } while (sVar2 <= nbits + 1 >> 1);
      H.p._4_4_ = mbedtls_mpi_add_int(&ctx->P,&ctx->P,1);
      if (((H.p._4_4_ == 0) && (H.p._4_4_ = mbedtls_mpi_add_int(&ctx->Q,&ctx->Q,1), H.p._4_4_ == 0))
         && (H.p._4_4_ = mbedtls_mpi_mul_mpi(&ctx->N,&ctx->P,&ctx->Q), H.p._4_4_ == 0)) {
        sVar2 = mbedtls_mpi_size(&ctx->N);
        ctx->len = sVar2;
        H.p._4_4_ = mbedtls_rsa_deduce_crt(&ctx->P,&ctx->Q,&ctx->D,&ctx->DP,&ctx->DQ,&ctx->QP);
        if (H.p._4_4_ == 0) {
          H.p._4_4_ = mbedtls_rsa_check_privkey(ctx);
        }
      }
    }
LAB_0013ae8a:
    mbedtls_mpi_free((mbedtls_mpi *)&G.p);
    mbedtls_mpi_free((mbedtls_mpi *)&L.p);
    mbedtls_mpi_free((mbedtls_mpi *)local_80);
    if (H.p._4_4_ == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      mbedtls_rsa_free(ctx);
      ctx_local._4_4_ = H.p._4_4_ + -0x4180;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_gen_key( mbedtls_rsa_context *ctx,
                 int (*f_rng)(void *, unsigned char *, size_t),
                 void *p_rng,
                 unsigned int nbits, int exponent )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi H, G, L;
    int prime_quality = 0;
    RSA_VALIDATE_RET( ctx != NULL );
    RSA_VALIDATE_RET( f_rng != NULL );

    if( nbits < 128 || exponent < 3 || nbits % 2 != 0 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    /*
     * If the modulus is 1024 bit long or shorter, then the security strength of
     * the RSA algorithm is less than or equal to 80 bits and therefore an error
     * rate of 2^-80 is sufficient.
     */
    if( nbits > 1024 )
        prime_quality = MBEDTLS_MPI_GEN_PRIME_FLAG_LOW_ERR;

    mbedtls_mpi_init( &H );
    mbedtls_mpi_init( &G );
    mbedtls_mpi_init( &L );

    /*
     * find primes P and Q with Q < P so that:
     * 1.  |P-Q| > 2^( nbits / 2 - 100 )
     * 2.  GCD( E, (P-1)*(Q-1) ) == 1
     * 3.  E^-1 mod LCM(P-1, Q-1) > 2^( nbits / 2 )
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &ctx->E, exponent ) );

    do
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_gen_prime( &ctx->P, nbits >> 1,
                                                prime_quality, f_rng, p_rng ) );

        MBEDTLS_MPI_CHK( mbedtls_mpi_gen_prime( &ctx->Q, nbits >> 1,
                                                prime_quality, f_rng, p_rng ) );

        /* make sure the difference between p and q is not too small (FIPS 186-4 §B.3.3 step 5.4) */
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &H, &ctx->P, &ctx->Q ) );
        if( mbedtls_mpi_bitlen( &H ) <= ( ( nbits >= 200 ) ? ( ( nbits >> 1 ) - 99 ) : 0 ) )
            continue;

        /* not required by any standards, but some users rely on the fact that P > Q */
        if( H.s < 0 )
            mbedtls_mpi_swap( &ctx->P, &ctx->Q );

        /* Temporarily replace P,Q by P-1, Q-1 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &ctx->P, &ctx->P, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &ctx->Q, &ctx->Q, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &H, &ctx->P, &ctx->Q ) );

        /* check GCD( E, (P-1)*(Q-1) ) == 1 (FIPS 186-4 §B.3.1 criterion 2(a)) */
        MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G, &ctx->E, &H  ) );
        if( mbedtls_mpi_cmp_int( &G, 1 ) != 0 )
            continue;

        /* compute smallest possible D = E^-1 mod LCM(P-1, Q-1) (FIPS 186-4 §B.3.1 criterion 3(b)) */
        MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G, &ctx->P, &ctx->Q ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_div_mpi( &L, NULL, &H, &G ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &ctx->D, &ctx->E, &L ) );

        if( mbedtls_mpi_bitlen( &ctx->D ) <= ( ( nbits + 1 ) / 2 ) ) // (FIPS 186-4 §B.3.1 criterion 3(a))
            continue;

        break;
    }
    while( 1 );

    /* Restore P,Q */
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( &ctx->P,  &ctx->P, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( &ctx->Q,  &ctx->Q, 1 ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ctx->N, &ctx->P, &ctx->Q ) );

    ctx->len = mbedtls_mpi_size( &ctx->N );

#if !defined(MBEDTLS_RSA_NO_CRT)
    /*
     * DP = D mod (P - 1)
     * DQ = D mod (Q - 1)
     * QP = Q^-1 mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_rsa_deduce_crt( &ctx->P, &ctx->Q, &ctx->D,
                                             &ctx->DP, &ctx->DQ, &ctx->QP ) );
#endif /* MBEDTLS_RSA_NO_CRT */

    /* Double-check */
    MBEDTLS_MPI_CHK( mbedtls_rsa_check_privkey( ctx ) );

cleanup:

    mbedtls_mpi_free( &H );
    mbedtls_mpi_free( &G );
    mbedtls_mpi_free( &L );

    if( ret != 0 )
    {
        mbedtls_rsa_free( ctx );
        return( MBEDTLS_ERR_RSA_KEY_GEN_FAILED + ret );
    }

    return( 0 );
}